

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O2

string * Statsd::detail::sanitizePrefix(string *__return_storage_ptr__,string *prefix)

{
  if ((prefix->_M_string_length != 0) &&
     ((prefix->_M_dataplus)._M_p[prefix->_M_string_length - 1] == '.')) {
    std::__cxx11::string::pop_back();
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)prefix);
  return __return_storage_ptr__;
}

Assistant:

inline std::string sanitizePrefix(std::string prefix) {
    // For convenience we provide the dot when generating the stat message
    if (!prefix.empty() && prefix.back() == '.') {
        prefix.pop_back();
    }
    return prefix;
}